

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int wally_base64_get_maximum_length(char *str_in,uint32_t flags,size_t *written)

{
  int iVar1;
  size_t srclen;
  size_t sVar2;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if ((((str_in != (char *)0x0) && (written != (size_t *)0x0)) && (flags == 0)) && (*str_in != '\0')
     ) {
    srclen = strlen(str_in);
    sVar2 = base64_decoded_length(srclen);
    *written = sVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_base64_get_maximum_length(const char *str_in, uint32_t flags, size_t *written)
{
    if (written)
        *written = 0;

    if (!str_in || !*str_in || flags || !written)
        return WALLY_EINVAL;

    *written = base64_decoded_length(strlen(str_in));
    return WALLY_OK;
}